

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_ExpressionNotFail_x_iutest_x_Logical_Test::Body
          (iu_ExpressionNotFail_x_iutest_x_Logical_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestFlag TVar4;
  TestPartResultReporterInterface *pTVar5;
  undefined4 uVar6;
  int iVar7;
  TestFlag *pTVar8;
  Variable *pVVar9;
  char *in_R9;
  ScopedSPITestFlag guard_2;
  size_type __dnew;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar_1;
  ScopedSPITestFlag guard_1;
  TestFlag local_354;
  AssertionHelper local_350;
  ExpressionResult local_320;
  ExpressionLHS<int> local_2f8;
  long *local_2d0 [2];
  long local_2c0 [2];
  char local_2b0;
  SPIFailureChecker local_2a8;
  int local_26c [3];
  AssertionResult local_260;
  undefined1 local_238 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  AssertionResult local_1e8;
  int local_1bc;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  bool local_198;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_2a8.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)local_238);
  local_210._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_2f8,(int *)local_210);
  local_1e8.m_message._M_dataplus._M_p._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_320,&local_2f8,(int *)&local_1e8);
  local_354.m_test_flags._0_1_ = 1;
  iutest::detail::ExpressionResult::operator||
            ((ExpressionResult *)&local_350,&local_320,(bool *)&local_354);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_350,false);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,local_1b8._0_8_,(char *)(local_1b8._0_8_ + local_1b8._8_8_));
  local_2b0 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  paVar1 = &local_350.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_350.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  paVar2 = &local_320.m_result.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_result.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_320.m_result.m_message._M_dataplus._M_p,
                    local_320.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_message._M_dataplus._M_p != &local_2f8.m_message.field_2) {
    operator_delete(local_2f8.m_message._M_dataplus._M_p,
                    local_2f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_320,(internal *)local_2d0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || f() == 42))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,local_320.m_result.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2f8);
    local_350.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_350.m_part_result.super_iuCodeMessage.m_line = 0xde;
    local_350.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_350,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_350.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.m_result.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_320.m_result.m_message._M_dataplus._M_p,
                      local_320.m_result.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  uVar6 = local_238._0_4_;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = uVar6;
  local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x1b;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_350);
  local_1a8._M_allocated_capacity =
       (size_type)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '!';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '4';
  *(char *)(local_1b8._0_8_ + 0x12) = '2';
  *(char *)(local_1b8._0_8_ + 0x13) = ' ';
  *(char *)(local_1b8._0_8_ + 0x14) = '|';
  *(char *)(local_1b8._0_8_ + 0x15) = '|';
  *(char *)(local_1b8._0_8_ + 0x16) = ' ';
  *(char *)(local_1b8._0_8_ + 0x17) = 't';
  *(char *)(local_1b8._0_8_ + 0x18) = 'r';
  *(char *)(local_1b8._0_8_ + 0x19) = 'u';
  *(char *)(local_1b8._0_8_ + 0x1a) = 'e';
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '!';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  local_1b8._8_8_ = local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_260,&local_2a8,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar5 = local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar5;
  if (local_260.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,local_260.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_350);
    local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000de;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2a8,(Fixed *)local_1b8,false);
    if (local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2a8.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar3 = &local_260.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_260.m_message._M_dataplus._M_p,
                    local_260.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_2a8.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1e8);
  local_354.m_test_flags = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_2f8,&local_354.m_test_flags);
  local_26c[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_320,&local_2f8,local_26c + 2);
  local_26c[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_238,local_26c + 1);
  local_26c[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_260,(ExpressionLHS<int> *)local_238,local_26c);
  iutest::detail::ExpressionResult::operator||
            ((ExpressionResult *)&local_350,&local_320,(ExpressionResult *)&local_260);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_350,false);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_2b0 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_350.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_260.m_message._M_dataplus._M_p,
                    local_260.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._8_8_ != &local_220) {
    operator_delete((void *)local_238._8_8_,local_220._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_result.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_320.m_result.m_message._M_dataplus._M_p,
                    local_320.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_message._M_dataplus._M_p != &local_2f8.m_message.field_2) {
    operator_delete(local_2f8.m_message._M_dataplus._M_p,
                    local_2f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_320,(internal *)local_2d0,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || ::iutest::detail::ExpressionDecomposer()->* f() == 42))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,local_320.m_result.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2f8);
    local_350.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_350.m_part_result.super_iuCodeMessage.m_line = 0xdf;
    local_350.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_350,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_350.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.m_result.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_320.m_result.m_message._M_dataplus._M_p,
                      local_320.m_result.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  iVar7 = (int)local_1e8.m_message._M_dataplus._M_p;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = iVar7;
  local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x1f;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_350);
  local_1a8._M_allocated_capacity =
       (size_type)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '4';
  *(char *)(local_1b8._0_8_ + 0x12) = '2';
  *(char *)(local_1b8._0_8_ + 0x13) = ' ';
  *(char *)(local_1b8._0_8_ + 0x14) = '|';
  *(char *)(local_1b8._0_8_ + 0x15) = '|';
  *(char *)(local_1b8._0_8_ + 0x16) = ' ';
  *(char *)(local_1b8._0_8_ + 0x17) = '4';
  *(char *)(local_1b8._0_8_ + 0x18) = '2';
  *(char *)(local_1b8._0_8_ + 0x19) = ' ';
  *(char *)(local_1b8._0_8_ + 0x1a) = '=';
  *(char *)(local_1b8._0_8_ + 0x1b) = '=';
  *(char *)(local_1b8._0_8_ + 0x1c) = ' ';
  *(char *)(local_1b8._0_8_ + 0x1d) = '4';
  *(char *)(local_1b8._0_8_ + 0x1e) = '2';
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '!';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  local_1b8._8_8_ = local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)local_210,&local_2a8,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar5 = local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar5;
  if ((bool)local_1f8._M_local_buf[8] == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,(char *)CONCAT44(local_210._4_4_,local_210._0_4_),
               (allocator<char> *)&local_350);
    local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000df;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2a8,(Fixed *)local_1b8,false);
    if (local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2a8.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_),local_210._16_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_2a8.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_354);
  local_26c[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_2f8,local_26c + 2);
  local_26c[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_320,&local_2f8,local_26c + 1);
  local_26c[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_210,local_26c);
  local_1bc = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)local_238,(ExpressionLHS<int> *)local_210,&local_1bc);
  iutest::detail::ExpressionResult::GetResult(&local_260,(ExpressionResult *)local_238);
  iutest::detail::ExpressionResult::operator||((ExpressionResult *)&local_350,&local_320,&local_260)
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_350,false);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_2b0 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_350.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_260.m_message._M_dataplus._M_p,
                    local_260.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_) != local_238 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_),local_238._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._8_8_ != &local_1f8) {
    operator_delete((void *)local_210._8_8_,local_1f8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_result.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_320.m_result.m_message._M_dataplus._M_p,
                    local_320.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_message._M_dataplus._M_p != &local_2f8.m_message.field_2) {
    operator_delete(local_2f8.m_message._M_dataplus._M_p,
                    local_2f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_320,(internal *)local_2d0,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || (::iutest::detail::ExpressionDecomposer()->* f() == 42).GetResult()))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,local_320.m_result.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2f8);
    local_350.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_350.m_part_result.super_iuCodeMessage.m_line = 0xe0;
    local_350.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_350,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_350.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.m_result.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_320.m_result.m_message._M_dataplus._M_p,
                      local_320.m_result.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  TVar4.m_test_flags = local_354.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar4.m_test_flags;
  local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x1f;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_350);
  local_1a8._M_allocated_capacity =
       (size_type)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '4';
  *(char *)(local_1b8._0_8_ + 0x12) = '2';
  *(char *)(local_1b8._0_8_ + 0x13) = ' ';
  *(char *)(local_1b8._0_8_ + 0x14) = '|';
  *(char *)(local_1b8._0_8_ + 0x15) = '|';
  *(char *)(local_1b8._0_8_ + 0x16) = ' ';
  *(char *)(local_1b8._0_8_ + 0x17) = '4';
  *(char *)(local_1b8._0_8_ + 0x18) = '2';
  *(char *)(local_1b8._0_8_ + 0x19) = ' ';
  *(char *)(local_1b8._0_8_ + 0x1a) = '=';
  *(char *)(local_1b8._0_8_ + 0x1b) = '=';
  *(char *)(local_1b8._0_8_ + 0x1c) = ' ';
  *(char *)(local_1b8._0_8_ + 0x1d) = '4';
  *(char *)(local_1b8._0_8_ + 0x1e) = '2';
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '!';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  local_1b8._8_8_ = local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_350.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e8,&local_2a8,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar5 = local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar5;
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,
               (char *)CONCAT44(local_1e8.m_message._M_dataplus._M_p._4_4_,
                                (int)local_1e8.m_message._M_dataplus._M_p),
               (allocator<char> *)&local_350);
    local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000e0;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2a8,(Fixed *)local_1b8,false);
    if (local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2a8.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2a8.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e8.m_message._M_dataplus._M_p._4_4_,
                  (int)local_1e8.m_message._M_dataplus._M_p) != &local_1e8.m_message.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e8.m_message._M_dataplus._M_p._4_4_,
                             (int)local_1e8.m_message._M_dataplus._M_p),
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(ExpressionNotFail, Logical)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() != 42 || f() == 42 ), "expansion: 42 != 42 || true");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() != 42 IUTEST_OPERAND(||) f() == 42 ), "expansion: 42 != 42 || 42 == 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() != 42 || IUTEST_EXPRESSION(f() == 42) ), "expansion: 42 != 42 || 42 == 42");
}